

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LLVMValueRef CompileLlvmIfElse(LlvmCompilationContext *ctx,ExprIfElse *node)

{
  TypeBase *type;
  LLVMValueRef pLVar1;
  
  CompileLlvm(ctx,node->condition);
  type = GetStackType(ctx,node->condition->type);
  CompileLlvmType(ctx,type);
  CompileLlvm(ctx,node->trueBlock);
  if (node->falseBlock != (ExprBase *)0x0) {
    CompileLlvm(ctx,node->falseBlock);
  }
  pLVar1 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)0x0);
  return pLVar1;
}

Assistant:

LLVMValueRef CompileLlvmIfElse(LlvmCompilationContext &ctx, ExprIfElse *node)
{
	LLVMValueRef condition = CompileLlvm(ctx, node->condition);

	condition = LLVMBuildICmp(ctx.builder, LLVMIntNE, condition, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->condition->type)), 0, true), "");

	LLVMBasicBlockRef trueBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "if_true");
	LLVMBasicBlockRef falseBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "if_false");
	LLVMBasicBlockRef exitBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "if_exit");

	if(node->falseBlock)
		LLVMBuildCondBr(ctx.builder, condition, trueBlock, falseBlock);
	else
		LLVMBuildCondBr(ctx.builder, condition, trueBlock, exitBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, trueBlock);

	CompileLlvm(ctx, node->trueBlock);

	LLVMBuildBr(ctx.builder, exitBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, falseBlock);

	if(node->falseBlock)
		CompileLlvm(ctx, node->falseBlock);

	LLVMBuildBr(ctx.builder, exitBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, exitBlock);

	return CheckType(ctx, node, NULL);
}